

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_python.cpp
# Opt level: O0

void __thiscall
flatbuffers::python::anon_unknown_0::PythonStubGenerator::StructBuilderArgs
          (PythonStubGenerator *this,StructDef *struct_def,string *prefix,Imports *imports,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args)

{
  StructDef *struct_def_00;
  bool bVar1;
  vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_> *this_00;
  reference ppFVar2;
  string local_180;
  string local_160;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_140;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_120;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_100;
  string local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  undefined1 local_70 [8];
  Type type;
  FieldDef *field;
  const_iterator __end3;
  const_iterator __begin3;
  vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_> *__range3;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *args_local;
  Imports *imports_local;
  string *prefix_local;
  StructDef *struct_def_local;
  PythonStubGenerator *this_local;
  
  this_00 = &(struct_def->fields).vec;
  __end3 = std::vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>::begin
                     (this_00);
  field = (FieldDef *)
          std::vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>::end
                    (this_00);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end3,(__normal_iterator<flatbuffers::FieldDef_*const_*,_std::vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>_>
                                *)&field);
    if (!bVar1) break;
    ppFVar2 = __gnu_cxx::
              __normal_iterator<flatbuffers::FieldDef_*const_*,_std::vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>_>
              ::operator*(&__end3);
    type._24_8_ = *ppFVar2;
    bVar1 = IsArray(&(((FieldDef *)type._24_8_)->value).type);
    if (bVar1) {
      Type::VectorType((Type *)local_70,(Type *)(type._24_8_ + 200));
    }
    else {
      local_70 = *(undefined1 (*) [8])(type._24_8_ + 200);
      type._0_8_ = *(undefined8 *)(type._24_8_ + 0xd0);
      type.struct_def = *(StructDef **)(type._24_8_ + 0xd8);
      type.enum_def = *(EnumDef **)(type._24_8_ + 0xe0);
    }
    if (local_70._0_4_ == BASE_TYPE_STRUCT) {
      struct_def_00 = *(StructDef **)(type._24_8_ + 0xd0);
      IdlNamer::Field_abi_cxx11_(&local_d0,&this->namer_,(FieldDef *)type._24_8_);
      std::operator+(&local_b0,prefix,&local_d0);
      std::operator+(&local_90,&local_b0,"_");
      StructBuilderArgs(this,struct_def_00,&local_90,imports,args);
      std::__cxx11::string::~string((string *)&local_90);
      std::__cxx11::string::~string((string *)&local_b0);
      std::__cxx11::string::~string((string *)&local_d0);
    }
    else {
      IdlNamer::Field_abi_cxx11_(&local_160,&this->namer_,(FieldDef *)type._24_8_);
      std::operator+(&local_140,prefix,&local_160);
      std::operator+(&local_120,&local_140,": ");
      (anonymous_namespace)::PythonStubGenerator::TypeOf_abi_cxx11_
                (&local_180,(PythonStubGenerator *)this,(Type *)local_70,imports);
      std::operator+(&local_100,&local_120,&local_180);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(args,&local_100);
      std::__cxx11::string::~string((string *)&local_100);
      std::__cxx11::string::~string((string *)&local_180);
      std::__cxx11::string::~string((string *)&local_120);
      std::__cxx11::string::~string((string *)&local_140);
      std::__cxx11::string::~string((string *)&local_160);
    }
    __gnu_cxx::
    __normal_iterator<flatbuffers::FieldDef_*const_*,_std::vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>_>
    ::operator++(&__end3);
  }
  return;
}

Assistant:

void StructBuilderArgs(const StructDef &struct_def, const std::string prefix,
                         Imports *imports,
                         std::vector<std::string> *args) const {
    for (const FieldDef *field : struct_def.fields.vec) {
      const Type type = IsArray(field->value.type)
                            ? field->value.type.VectorType()
                            : field->value.type;
      if (type.base_type == BASE_TYPE_STRUCT) {
        StructBuilderArgs(*field->value.type.struct_def,
                          prefix + namer_.Field(*field) + "_", imports, args);
      } else {
        args->push_back(prefix + namer_.Field(*field) + ": " +
                        TypeOf(type, imports));
      }
    }
  }